

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
pstore::small_vector<unsigned_char,_128UL>::small_vector
          (small_vector<unsigned_char,_128UL> *this,small_vector<unsigned_char,_128UL> *rhs)

{
  memset(this,0,0xa0);
  this->buffer_ = (this->small_buffer_)._M_elems;
  reserve(this,rhs->elements_);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<pstore::pointer_based_iterator<unsigned_char_const>,std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>>
            ((pointer_based_iterator<const_unsigned_char>)rhs->buffer_,
             (pointer_based_iterator<const_unsigned_char>)(rhs->buffer_ + rhs->elements_),
             (back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>)this);
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (small_vector const & rhs)
            : small_vector () {
        this->reserve (rhs.size ());
        std::copy (std::begin (rhs), std::end (rhs), std::back_inserter (*this));
    }